

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O2

void UI::process_co_ords(vector<int,_std::allocator<int>_> *co_ords,int *points_gathered)

{
  int iVar1;
  bool bVar2;
  string *this;
  int local_d4;
  string placeholder;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  placeholder._M_dataplus._M_p = (pointer)&placeholder.field_2;
  placeholder._M_string_length = 0;
  placeholder.field_2._M_local_buf[0] = '\0';
  iVar1 = *points_gathered;
  if (iVar1 == 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Please enter X2 co_ordinate:",(allocator<char> *)&local_d4);
    print_ln(&local_70);
    this = &local_70;
  }
  else if (iVar1 == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Please enter Y1 co_ordinate:",(allocator<char> *)&local_d4);
    print_ln(&local_50);
    this = &local_50;
  }
  else if (iVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Please enter X1 co_ordinate:",(allocator<char> *)&local_d4);
    print_ln(&local_30);
    this = &local_30;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Please enter Y2 co_ordinate:",(allocator<char> *)&local_d4);
    print_ln(&local_90);
    this = &local_90;
  }
  std::__cxx11::string::~string((string *)this);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&placeholder);
  bVar2 = isinteger(&placeholder);
  if (bVar2) {
    local_d4 = std::__cxx11::stoi(&placeholder,(size_t *)0x0,10);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(co_ords,&local_d4);
    if (2 < *points_gathered) goto LAB_0010f726;
    *points_gathered = *points_gathered + 1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"The last value entered is not an integer.",
               (allocator<char> *)&local_d4);
    print_ln(&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  process_co_ords(co_ords,points_gathered);
LAB_0010f726:
  std::__cxx11::string::~string((string *)&placeholder);
  return;
}

Assistant:

void UI::process_co_ords(std::vector<int> &co_ords, int &points_gathered)
{
    std::string placeholder;
    switch (points_gathered)
    {
    case 0:
        print_ln("Please enter X1 co_ordinate:");
        break;
    case 1:
        print_ln("Please enter Y1 co_ordinate:");
        break;
    case 2:
        print_ln("Please enter X2 co_ordinate:");
        break;
    default:
        print_ln("Please enter Y2 co_ordinate:");
        break;
    }
    getline(std::cin, placeholder);
    if (isinteger(placeholder))
    {
        co_ords.push_back(std::stoi(placeholder));
        if (points_gathered < 3)
        {
            points_gathered++;
            process_co_ords(co_ords, points_gathered);
        }
    }
    else
    {
        print_ln("The last value entered is not an integer.");
        process_co_ords(co_ords, points_gathered);
    }
}